

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_898a9ca8 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  c;
  CliqueVar CVar1;
  CliqueVar CVar2;
  uint uVar3;
  CliqueVar *pCVar4;
  T tmp_1;
  long lVar5;
  CliqueVar *pCVar6;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var7;
  uint uVar8;
  ulong uVar9;
  CliqueVar *pCVar10;
  pointer pdVar11;
  long lVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  ulong uVar14;
  uint uVar15;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var16;
  CliqueVar *pCVar17;
  long lVar18;
  CliqueVar __tmp;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
  __cmp;
  ulong uVar22;
  ulong uVar23;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  b;
  bool bVar24;
  double dVar25;
  double dVar26;
  _DistanceType __len;
  int local_74;
  
  uVar9 = (long)end._M_current - (long)begin._M_current >> 2;
  if ((long)uVar9 < 0x18) {
    if (!leftmost) {
LAB_00265176:
      if (begin._M_current + 1 == end._M_current || begin._M_current == end._M_current) {
        return;
      }
      pvVar13 = (comp.data)->sol;
      pCVar6 = begin._M_current + 1;
      do {
        pCVar10 = pCVar6;
        CVar1 = begin._M_current[1];
        if ((int)CVar1 < 0) {
          pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
        }
        else {
          pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar25 = 1.0 - pdVar11[(uint)CVar1];
        }
        CVar2 = *begin._M_current;
        uVar9 = (ulong)(uint)CVar2;
        if ((int)CVar2 < 0) {
          dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
        }
        else {
          dVar26 = 1.0 - pdVar11[uVar9];
        }
        uVar15 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
        if ((dVar26 < dVar25) ||
           (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar15 && (dVar26 <= dVar25))))
        {
          pCVar6 = pCVar10;
          while( true ) {
            *pCVar6 = SUB84(uVar9,0);
            pdVar11 = ((comp.data)->sol->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((int)CVar1 < 0) {
              dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
            }
            else {
              dVar25 = 1.0 - pdVar11[(uint)CVar1];
            }
            CVar2 = pCVar6[-2];
            uVar9 = (ulong)(uint)CVar2;
            if ((int)CVar2 < 0) {
              dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar9];
            }
            if ((dVar25 <= dVar26) &&
               (((int)uVar15 <= (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) || (dVar25 < dVar26)
                ))) break;
            pCVar6 = pCVar6 + -1;
          }
          pCVar6[-1] = CVar1;
          pvVar13 = (comp.data)->sol;
        }
        pCVar6 = pCVar10 + 1;
        begin._M_current = pCVar10;
      } while (pCVar10 + 1 != end._M_current);
      return;
    }
  }
  else {
    c._M_current = end._M_current + -1;
    lVar5 = (long)end._M_current - (long)begin._M_current;
    b._M_current = begin._M_current;
    local_74 = bad_allowed;
    do {
      uVar22 = uVar9 >> 1;
      _Var16._M_current = b._M_current + uVar22;
      if (uVar9 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (_Var16,b,c,comp);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (b,_Var16,c,comp);
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (b._M_current + 1,b._M_current + (uVar22 - 1),end._M_current + -2,comp);
        pCVar6 = b._M_current + uVar22;
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (b._M_current + 2,pCVar6 + 1,end._M_current + -3,comp);
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (b._M_current + (uVar22 - 1),_Var16,pCVar6 + 1,comp);
        CVar1 = *b._M_current;
        *b._M_current = *pCVar6;
        *pCVar6 = CVar1;
      }
      CVar1 = *b._M_current;
      uVar22 = (ulong)(uint)CVar1;
      pvVar13 = (comp.data)->sol;
      if ((leftmost & 1U) == 0) {
        CVar2 = b._M_current[-1];
        if ((int)CVar2 < 0) {
          pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar25 = pdVar11[(uint)CVar2 & 0x7fffffff];
        }
        else {
          pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          dVar25 = 1.0 - pdVar11[(uint)CVar2];
        }
        if ((int)CVar1 < 0) {
          dVar26 = pdVar11[(uint)CVar1 & 0x7fffffff];
        }
        else {
          dVar26 = 1.0 - pdVar11[uVar22];
        }
        uVar15 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
        if ((dVar26 < dVar25) ||
           (((int)uVar15 < (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) && (dVar26 <= dVar25))))
        goto LAB_00264869;
        uVar8 = (uint)CVar1 & 0x7fffffff;
        lVar5 = 0;
        while( true ) {
          if ((int)CVar1 < 0) {
            dVar25 = pdVar11[uVar8];
          }
          else {
            dVar25 = 1.0 - pdVar11[uVar22];
          }
          uVar3 = *(uint *)(&(c._M_current)->field_0x0 + lVar5);
          uVar9 = (ulong)uVar3;
          if ((int)uVar3 < 0) {
            dVar26 = pdVar11[uVar3 & 0x7fffffff];
          }
          else {
            dVar26 = 1.0 - pdVar11[uVar9];
          }
          if ((dVar25 <= dVar26) &&
             (((int)uVar15 <= (int)(uVar3 << 1 | (uint)((int)uVar3 < 0)) || (dVar25 < dVar26))))
          break;
          lVar5 = lVar5 + -4;
        }
        pCVar6 = (CliqueVar *)(&(c._M_current)->field_0x0 + lVar5);
        uVar19 = uVar22;
        _Var16._M_current = b._M_current;
        if (lVar5 == 0) {
          while (_Var16._M_current < pCVar6) {
            _Var16._M_current = _Var16._M_current + 1;
            if ((int)CVar1 < 0) {
              dVar25 = pdVar11[uVar8];
            }
            else {
              dVar25 = 1.0 - pdVar11[uVar22];
            }
            CVar2 = *_Var16._M_current;
            uVar19 = (ulong)(uint)CVar2;
            if ((int)CVar2 < 0) {
              dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar19];
            }
            if ((dVar26 < dVar25) ||
               ((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar15 && dVar26 <= dVar25))
            break;
          }
        }
        else {
          pCVar10 = b._M_current + 1;
          do {
            _Var16._M_current = pCVar10;
            if ((int)CVar1 < 0) {
              dVar25 = pdVar11[uVar8];
            }
            else {
              dVar25 = 1.0 - pdVar11[uVar22];
            }
            CVar2 = *_Var16._M_current;
            uVar19 = (ulong)(uint)CVar2;
            if ((int)CVar2 < 0) {
              dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar19];
            }
          } while ((dVar25 <= dVar26) &&
                  ((pCVar10 = _Var16._M_current + 1,
                   (int)uVar15 <= (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) ||
                   (dVar25 < dVar26))));
        }
        while (_Var16._M_current < pCVar6) {
          *_Var16._M_current = SUB84(uVar9,0);
          *pCVar6 = SUB84(uVar19,0);
          pdVar11 = ((comp.data)->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            pCVar6 = pCVar6 + -1;
            CVar2 = *pCVar6;
            uVar9 = (ulong)(uint)CVar2;
            if ((int)CVar1 < 0) {
              dVar25 = pdVar11[uVar8];
            }
            else {
              dVar25 = 1.0 - pdVar11[uVar22];
            }
            if ((int)CVar2 < 0) {
              dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar9];
            }
          } while ((dVar26 < dVar25) ||
                  (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar15 &&
                   (dVar26 <= dVar25))));
          pCVar10 = _Var16._M_current + 1;
          do {
            _Var16._M_current = pCVar10;
            CVar2 = *_Var16._M_current;
            uVar19 = (ulong)(uint)CVar2;
            if ((int)CVar1 < 0) {
              dVar25 = pdVar11[uVar8];
            }
            else {
              dVar25 = 1.0 - pdVar11[uVar22];
            }
            if ((int)CVar2 < 0) {
              dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar19];
            }
          } while ((dVar25 <= dVar26) &&
                  ((pCVar10 = _Var16._M_current + 1,
                   (int)uVar15 <= (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) ||
                   (dVar25 < dVar26))));
        }
        *b._M_current = SUB84(uVar9,0);
        *pCVar6 = CVar1;
        begin._M_current = pCVar6 + 1;
        lVar12 = (long)end._M_current - (long)begin._M_current;
        uVar9 = lVar12 >> 2;
      }
      else {
        uVar15 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
LAB_00264869:
        uVar8 = (uint)CVar1 & 0x7fffffff;
        uVar19 = 4;
        while( true ) {
          uVar3 = *(uint *)(&(b._M_current)->field_0x0 + uVar19);
          uVar14 = (ulong)uVar3;
          if ((int)uVar3 < 0) {
            pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar25 = pdVar11[uVar3 & 0x7fffffff];
          }
          else {
            pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar25 = 1.0 - pdVar11[uVar14];
          }
          if ((int)CVar1 < 0) {
            dVar26 = pdVar11[uVar8];
          }
          else {
            dVar26 = 1.0 - pdVar11[uVar22];
          }
          if ((dVar25 <= dVar26) &&
             (((int)(uVar3 << 1 | (uint)((int)uVar3 < 0)) <= (int)uVar15 || (dVar25 < dVar26))))
          break;
          uVar19 = uVar19 + 4;
        }
        pCVar6 = (CliqueVar *)(&(b._M_current)->field_0x0 + uVar19);
        _Var16._M_current = c._M_current;
        if (uVar19 == 4) {
          while (pCVar17 = _Var16._M_current, pCVar10 = pCVar17 + 1, pCVar6 < pCVar17 + 1) {
            CVar2 = *pCVar17;
            if ((int)CVar2 < 0) {
              dVar25 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar25 = 1.0 - pdVar11[(uint)CVar2];
            }
            if ((int)CVar1 < 0) {
              dVar26 = pdVar11[uVar8];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar22];
            }
            pCVar10 = pCVar17;
            if ((dVar26 < dVar25) ||
               ((_Var16._M_current = pCVar17 + -1,
                (int)uVar15 < (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) && (dVar26 <= dVar25))
               )) break;
          }
        }
        else {
          do {
            pCVar10 = _Var16._M_current;
            CVar2 = *pCVar10;
            if ((int)CVar2 < 0) {
              dVar25 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar25 = 1.0 - pdVar11[(uint)CVar2];
            }
            if ((int)CVar1 < 0) {
              dVar26 = pdVar11[uVar8];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar22];
            }
          } while ((dVar25 <= dVar26) &&
                  ((_Var16._M_current = pCVar10 + -1,
                   (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) <= (int)uVar15 ||
                   (dVar25 < dVar26))));
        }
        if (pCVar6 < pCVar10) {
          uVar23 = (ulong)(uint)*pCVar10;
          pCVar17 = pCVar10;
          do {
            *(int *)(&(b._M_current)->field_0x0 + uVar19) = (int)uVar23;
            *pCVar17 = SUB84(uVar14,0);
            uVar21 = uVar19;
            while( true ) {
              uVar3 = *(uint *)(&b._M_current[1].field_0x0 + uVar21);
              uVar14 = (ulong)uVar3;
              if ((int)uVar3 < 0) {
                pdVar11 = ((comp.data)->sol->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                dVar25 = pdVar11[uVar3 & 0x7fffffff];
              }
              else {
                pdVar11 = ((comp.data)->sol->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                dVar25 = 1.0 - pdVar11[uVar14];
              }
              if ((int)CVar1 < 0) {
                dVar26 = pdVar11[uVar8];
              }
              else {
                dVar26 = 1.0 - pdVar11[uVar22];
              }
              if ((dVar25 <= dVar26) &&
                 (((int)(uVar3 << 1 | (uint)((int)uVar3 < 0)) <= (int)uVar15 || (dVar25 < dVar26))))
              break;
              uVar21 = uVar21 + 4;
            }
            uVar19 = uVar21 + 4;
            pCVar4 = pCVar17 + -1;
            do {
              pCVar17 = pCVar4;
              CVar2 = *pCVar17;
              uVar23 = (ulong)(uint)CVar2;
              if ((int)CVar2 < 0) {
                dVar25 = pdVar11[(uint)CVar2 & 0x7fffffff];
              }
              else {
                dVar25 = 1.0 - pdVar11[uVar23];
              }
              if ((int)CVar1 < 0) {
                dVar26 = pdVar11[uVar8];
              }
              else {
                dVar26 = 1.0 - pdVar11[uVar22];
              }
            } while ((dVar25 <= dVar26) &&
                    ((pCVar4 = pCVar17 + -1,
                     (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) <= (int)uVar15 ||
                     (dVar25 < dVar26))));
          } while ((CliqueVar *)(&b._M_current[1].field_0x0 + uVar21) < pCVar17);
        }
        else {
          uVar21 = uVar19 - 4;
        }
        _Var16._M_current = (CliqueVar *)(&(b._M_current)->field_0x0 + uVar21);
        pCVar17 = (CliqueVar *)(&(b._M_current)->field_0x0 + uVar21);
        begin._M_current = pCVar17 + 1;
        *b._M_current = *pCVar17;
        *pCVar17 = CVar1;
        uVar22 = (long)_Var16._M_current - (long)b._M_current >> 2;
        lVar12 = (long)end._M_current - (long)begin._M_current;
        uVar19 = lVar12 >> 2;
        if (((long)uVar22 < (long)(uVar9 >> 3)) || ((long)uVar19 < (long)(uVar9 >> 3))) {
          local_74 = local_74 + -1;
          if (local_74 == 0) {
            uVar22 = uVar9 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>>
                        (b,uVar22,uVar9,b._M_current[uVar22],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
                          )comp.data);
              bVar24 = uVar22 != 0;
              uVar22 = uVar22 - 1;
            } while (bVar24);
            if (lVar5 < 5) {
              return;
            }
            lVar5 = (long)end._M_current - (long)b._M_current;
            do {
              end._M_current = end._M_current + -1;
              CVar1 = *end._M_current;
              *end._M_current = *b._M_current;
              lVar5 = lVar5 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>>
                        (b,0,lVar5 >> 2,CVar1,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
                          )comp.data);
            } while (4 < lVar5);
            return;
          }
          if (0x17 < (long)uVar22) {
            uVar9 = uVar22 & 0xfffffffffffffffc;
            CVar1 = *b._M_current;
            *b._M_current = *(CliqueVar *)(&(b._M_current)->field_0x0 + uVar9);
            *(CliqueVar *)(&(b._M_current)->field_0x0 + uVar9) = CVar1;
            CVar1 = _Var16._M_current[-1];
            _Var16._M_current[-1] = *(CliqueVar *)((long)_Var16._M_current - uVar9);
            *(CliqueVar *)((long)_Var16._M_current - uVar9) = CVar1;
            if (0x80 < uVar22) {
              uVar22 = uVar22 >> 2;
              CVar1 = b._M_current[1];
              b._M_current[1] = b._M_current[uVar22 + 1];
              b._M_current[uVar22 + 1] = CVar1;
              CVar1 = b._M_current[2];
              b._M_current[2] = b._M_current[uVar22 + 2];
              b._M_current[uVar22 + 2] = CVar1;
              CVar1 = _Var16._M_current[-2];
              _Var16._M_current[-2] = _Var16._M_current[~uVar22];
              _Var16._M_current[~uVar22] = CVar1;
              CVar1 = _Var16._M_current[-3];
              _Var16._M_current[-3] = _Var16._M_current[-2 - uVar22];
              _Var16._M_current[-2 - uVar22] = CVar1;
            }
          }
          if (0x17 < (long)uVar19) {
            uVar9 = uVar19 & 0xfffffffffffffffc;
            CVar1 = _Var16._M_current[1];
            _Var16._M_current[1] = *(CliqueVar *)(&_Var16._M_current[1].field_0x0 + uVar9);
            *(CliqueVar *)(&_Var16._M_current[1].field_0x0 + uVar9) = CVar1;
            CVar1 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar9);
            *(end._M_current - uVar9) = CVar1;
            if (0x80 < uVar19) {
              uVar9 = uVar19 >> 2;
              CVar1 = _Var16._M_current[2];
              _Var16._M_current[2] = _Var16._M_current[uVar9 + 2];
              _Var16._M_current[uVar9 + 2] = CVar1;
              CVar1 = _Var16._M_current[3];
              _Var16._M_current[3] = _Var16._M_current[uVar9 + 3];
              _Var16._M_current[uVar9 + 3] = CVar1;
              CVar1 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar9];
              end._M_current[~uVar9] = CVar1;
              CVar1 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar9];
              end._M_current[-2 - uVar9] = CVar1;
            }
          }
        }
        else if (pCVar10 <= pCVar6) {
          if ((uVar21 & 0xfffffffffffffffb) != 0) {
            pvVar13 = (comp.data)->sol;
            lVar5 = 0;
            uVar9 = 0;
            _Var7._M_current = b._M_current;
            pCVar6 = b._M_current + 1;
            do {
              CVar1 = _Var7._M_current[1];
              if ((int)CVar1 < 0) {
                pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
              }
              else {
                pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                dVar25 = 1.0 - pdVar11[(uint)CVar1];
              }
              CVar2 = *_Var7._M_current;
              if ((int)CVar2 < 0) {
                dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
              }
              else {
                dVar26 = 1.0 - pdVar11[(uint)CVar2];
              }
              uVar15 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
              if ((dVar26 < dVar25) ||
                 (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar15 &&
                  (dVar26 <= dVar25)))) {
                _Var7._M_current[1] = CVar2;
                _Var7._M_current = b._M_current;
                if (pCVar6 + -1 != b._M_current) {
                  lVar18 = lVar5;
                  do {
                    pdVar11 = ((comp.data)->sol->super__Vector_base<double,_std::allocator<double>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    if ((int)CVar1 < 0) {
                      dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
                    }
                    else {
                      dVar25 = 1.0 - pdVar11[(uint)CVar1];
                    }
                    uVar8 = *(uint *)(&b._M_current[-1].field_0x0 + lVar18);
                    if ((int)uVar8 < 0) {
                      dVar26 = pdVar11[uVar8 & 0x7fffffff];
                    }
                    else {
                      dVar26 = 1.0 - pdVar11[uVar8];
                    }
                    if ((dVar25 <= dVar26) &&
                       (((int)uVar15 <= (int)(uVar8 << 1 | (uint)((int)uVar8 < 0)) ||
                        (dVar25 < dVar26)))) {
                      _Var7._M_current = (CliqueVar *)(&(b._M_current)->field_0x0 + lVar18);
                      break;
                    }
                    *(uint *)(&(b._M_current)->field_0x0 + lVar18) = uVar8;
                    lVar18 = lVar18 + -4;
                  } while (lVar18 != 0);
                }
                *_Var7._M_current = CVar1;
                uVar9 = ((long)pCVar6 - (long)_Var7._M_current >> 2) + uVar9;
                if (8 < uVar9) goto LAB_00264ee5;
                pvVar13 = (comp.data)->sol;
              }
              pCVar10 = pCVar6 + 1;
              lVar5 = lVar5 + 4;
              _Var7._M_current = pCVar6;
              pCVar6 = pCVar10;
            } while (pCVar10 != _Var16._M_current);
          }
          if (begin._M_current == end._M_current) {
            return;
          }
          if (_Var16._M_current + 2 == end._M_current) {
            return;
          }
          pvVar13 = (comp.data)->sol;
          lVar5 = 8;
          lVar18 = 0;
          uVar9 = 0;
          pCVar6 = begin._M_current;
          do {
            CVar1 = *(CliqueVar *)(&(_Var16._M_current)->field_0x0 + lVar5);
            if ((int)CVar1 < 0) {
              pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
            }
            else {
              pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              dVar25 = 1.0 - pdVar11[(uint)CVar1];
            }
            CVar2 = *pCVar6;
            if ((int)CVar2 < 0) {
              dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar26 = 1.0 - pdVar11[(uint)CVar2];
            }
            pCVar6 = (CliqueVar *)(&(_Var16._M_current)->field_0x0 + lVar5);
            uVar15 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
            if ((dVar26 < dVar25) ||
               (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar15 && (dVar26 <= dVar25)
                ))) {
              *pCVar6 = CVar2;
              pCVar10 = begin._M_current;
              if (lVar5 != 8) {
                lVar20 = lVar18;
                do {
                  pdVar11 = ((comp.data)->sol->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  if ((int)CVar1 < 0) {
                    dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
                  }
                  else {
                    dVar25 = 1.0 - pdVar11[(uint)CVar1];
                  }
                  uVar8 = *(uint *)((long)&pCVar17->field_0x0 + lVar20);
                  if ((int)uVar8 < 0) {
                    dVar26 = pdVar11[uVar8 & 0x7fffffff];
                  }
                  else {
                    dVar26 = 1.0 - pdVar11[uVar8];
                  }
                  if ((dVar25 <= dVar26) &&
                     (((int)uVar15 <= (int)(uVar8 << 1 | (uint)((int)uVar8 < 0)) ||
                      (dVar25 < dVar26)))) {
                    pCVar10 = (CliqueVar *)((long)&(begin._M_current)->field_0x0 + lVar20);
                    break;
                  }
                  *(uint *)((long)&(begin._M_current)->field_0x0 + lVar20) = uVar8;
                  lVar20 = lVar20 + -4;
                } while (lVar20 != 0);
              }
              *pCVar10 = CVar1;
              uVar9 = ((long)pCVar6 - (long)pCVar10 >> 2) + uVar9;
              if (8 < uVar9) break;
              pvVar13 = (comp.data)->sol;
            }
            pCVar10 = (CliqueVar *)(&_Var16._M_current[1].field_0x0 + lVar5);
            lVar5 = lVar5 + 4;
            lVar18 = lVar18 + 4;
            if (pCVar10 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_00264ee5:
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
                  (b,_Var16,comp,local_74,(bool)(leftmost & 1));
        leftmost = false;
        uVar9 = uVar19;
      }
      lVar5 = lVar12;
      b._M_current = begin._M_current;
    } while (0x17 < (long)uVar9);
    if ((leftmost & 1U) == 0) goto LAB_00265176;
  }
  if (begin._M_current + 1 != end._M_current && begin._M_current != end._M_current) {
    pvVar13 = (comp.data)->sol;
    lVar5 = 0;
    pCVar6 = begin._M_current;
    pCVar10 = begin._M_current + 1;
    do {
      CVar1 = pCVar6[1];
      if ((int)CVar1 < 0) {
        pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
      }
      else {
        pdVar11 = (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar25 = 1.0 - pdVar11[(uint)CVar1];
      }
      CVar2 = *pCVar6;
      if ((int)CVar2 < 0) {
        dVar26 = pdVar11[(uint)CVar2 & 0x7fffffff];
      }
      else {
        dVar26 = 1.0 - pdVar11[(uint)CVar2];
      }
      uVar15 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
      if ((dVar26 < dVar25) ||
         (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar15 && (dVar26 <= dVar25)))) {
        pCVar6[1] = CVar2;
        pCVar6 = begin._M_current;
        if (pCVar10 + -1 != begin._M_current) {
          lVar12 = lVar5;
          do {
            pdVar11 = ((comp.data)->sol->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((int)CVar1 < 0) {
              dVar25 = pdVar11[(uint)CVar1 & 0x7fffffff];
            }
            else {
              dVar25 = 1.0 - pdVar11[(uint)CVar1];
            }
            uVar8 = *(uint *)((long)&begin._M_current[-1].field_0x0 + lVar12);
            if ((int)uVar8 < 0) {
              dVar26 = pdVar11[uVar8 & 0x7fffffff];
            }
            else {
              dVar26 = 1.0 - pdVar11[uVar8];
            }
            if ((dVar25 <= dVar26) &&
               (((int)uVar15 <= (int)(uVar8 << 1 | (uint)((int)uVar8 < 0)) || (dVar25 < dVar26)))) {
              pCVar6 = (CliqueVar *)((long)&(begin._M_current)->field_0x0 + lVar12);
              break;
            }
            *(uint *)((long)&(begin._M_current)->field_0x0 + lVar12) = uVar8;
            lVar12 = lVar12 + -4;
          } while (lVar12 != 0);
        }
        *pCVar6 = CVar1;
        pvVar13 = (comp.data)->sol;
      }
      pCVar17 = pCVar10 + 1;
      lVar5 = lVar5 + 4;
      pCVar6 = pCVar10;
      pCVar10 = pCVar17;
    } while (pCVar17 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }